

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTestDepFileOK::Run(BuildTestDepFileOK *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  reference ppEVar6;
  Node *pNVar7;
  reference __rhs;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  value_type local_58;
  Edge *edge;
  int local_38;
  int local_34;
  int fail_count;
  int orig_edges;
  string err;
  BuildTestDepFileOK *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&fail_count);
  sVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::size
                    (&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_.edges_);
  local_34 = (int)sVar5;
  local_38 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&edge + 4));
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule cc\n  command = cc $in\n  depfile = $out.d\nbuild foo.o: cc foo.c\n",
              stack0xffffffffffffffb4);
  iVar4 = local_38;
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  if (iVar4 == iVar3) {
    ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::back
                        (&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_.edges_);
    local_58 = *ppEVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"foo.c",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_78,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"bar.h",&local_c9);
    pNVar7 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_c8);
    Node::MarkDirty(pNVar7);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"foo.o.d",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"foo.o: blah.h bar.h\n",&local_119);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_f0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"foo.o",&local_141);
    pNVar7 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_140,(string *)&fail_count);
    testing::Test::Check
              (pTVar1,pNVar7 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x3be,"builder_.AddTarget(\"foo.o\", &err)");
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    pTVar1 = g_current_test;
    bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &fail_count);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x3bf,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar2) {
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->super_BuildTest).fs_.files_read_);
      bVar2 = testing::Test::Check
                        (pTVar1,sVar5 == 1,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x3c0,"1u == fs_.files_read_.size()");
      pTVar1 = g_current_test;
      if (bVar2) {
        __rhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&(this->super_BuildTest).fs_.files_read_,0);
        bVar2 = std::operator==("foo.o.d",__rhs);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x3c1,"\"foo.o.d\" == fs_.files_read_[0]");
        pTVar1 = g_current_test;
        iVar4 = local_34 + 3;
        sVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::size
                          (&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_.edges_);
        bVar2 = testing::Test::Check
                          (pTVar1,iVar4 == (int)sVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x3c5,"orig_edges + 3 == (int)state_.edges_.size()");
        pTVar1 = g_current_test;
        if (bVar2) {
          sVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&local_58->inputs_);
          bVar2 = testing::Test::Check
                            (pTVar1,sVar5 == 3,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0x3c7,"3u == edge->inputs_.size()");
          pTVar1 = g_current_test;
          if (bVar2) {
            Edge::EvaluateCommand_abi_cxx11_(&local_168,local_58,false);
            bVar2 = std::operator==("cc foo.c",&local_168);
            bVar2 = testing::Test::Check
                              (pTVar1,bVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                               ,0x3ca,"\"cc foo.c\" == edge->EvaluateCommand()");
            std::__cxx11::string::~string((string *)&local_168);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              edge._0_4_ = 0;
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              edge._0_4_ = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            edge._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          edge._0_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        edge._0_4_ = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      edge._0_4_ = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    edge._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)&fail_count);
  return;
}

Assistant:

TEST_F(BuildTest, DepFileOK) {
  string err;
  int orig_edges = state_.edges_.size();
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc\n  command = cc $in\n  depfile = $out.d\n"
"build foo.o: cc foo.c\n"));
  Edge* edge = state_.edges_.back();

  fs_.Create("foo.c", "");
  GetNode("bar.h")->MarkDirty();  // Mark bar.h as missing.
  fs_.Create("foo.o.d", "foo.o: blah.h bar.h\n");
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, fs_.files_read_.size());
  EXPECT_EQ("foo.o.d", fs_.files_read_[0]);

  // Expect three new edges: one generating foo.o, and two more from
  // loading the depfile.
  ASSERT_EQ(orig_edges + 3, (int)state_.edges_.size());
  // Expect our edge to now have three inputs: foo.c and two headers.
  ASSERT_EQ(3u, edge->inputs_.size());

  // Expect the command line we generate to only use the original input.
  ASSERT_EQ("cc foo.c", edge->EvaluateCommand());
}